

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void fs_event_cb_dir_multi_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  uv_fs_event_t *puVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar3 = fs_event_cb_called + 1;
  fs_event_cb_called = iVar3;
  if (handle == &fs_event) {
    eval_a = (int64_t)status;
    if (eval_a == 0) {
      if (1 < events - 1U) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
                ,199,"events == UV_CHANGE || events == UV_RENAME");
        abort();
      }
      iVar1 = strncmp(filename,"fsevent-",8);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        if (fs_event_removed + fs_event_created != 0x10) {
          if (iVar3 != 0x20) {
            return;
          }
          uv_close((uv_handle_t *)&timer,close_cb);
          uv_close((uv_handle_t *)&fs_event,close_cb);
          return;
        }
        iVar3 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        eval_a = (int64_t)iVar3;
        if (eval_a == 0) {
          return;
        }
        pcVar4 = "uv_timer_start(&timer, fs_event_unlink_files, 1, 0)";
        uVar2 = 0xd1;
      }
      else {
        pcVar4 = "strncmp(filename, file_prefix, sizeof(file_prefix) - 1)";
        uVar2 = 0xc9;
      }
    }
    else {
      pcVar4 = "status";
      uVar2 = 0xc6;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    puVar6 = (uv_fs_event_t *)0x0;
    pcVar5 = "0";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar4 = "handle";
    uVar2 = 0xc5;
    puVar6 = &fs_event;
    pcVar5 = "&fs_event";
    eval_a = (int64_t)handle;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar4,"==",pcVar5,eval_a,"==",puVar6);
  abort();
}

Assistant:

static void fs_event_cb_dir_multi_file(uv_fs_event_t* handle,
                                       const char* filename,
                                       int events,
                                       int status) {
  fs_event_cb_called++;
  ASSERT_PTR_EQ(handle, &fs_event);
  ASSERT_OK(status);
  ASSERT(events == UV_CHANGE || events == UV_RENAME);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT_OK(strncmp(filename, file_prefix, sizeof(file_prefix) - 1));
  #else
  ASSERT_NE(filename == NULL ||
            strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0, 0);
  #endif

  if (fs_event_created + fs_event_removed == fs_event_file_count) {
    /* Once we've processed all create events, delete all files */
    ASSERT_OK(uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
  } else if (fs_event_cb_called == 2 * fs_event_file_count) {
    /* Once we've processed all create and delete events, stop watching */
    uv_close((uv_handle_t*) &timer, close_cb);
    uv_close((uv_handle_t*) handle, close_cb);
  }
}